

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

Status __thiscall leveldb::anon_unknown_1::PosixWritableFile::Close(PosixWritableFile *this)

{
  _func_int **pp_Var1;
  int iVar2;
  _func_int **in_RAX;
  int *piVar3;
  long in_RSI;
  WritableFile local_28;
  
  local_28._vptr_WritableFile = in_RAX;
  FlushBuffer(this);
  iVar2 = close(*(int *)(in_RSI + 0x10010));
  if ((iVar2 < 0) && ((this->super_WritableFile)._vptr_WritableFile == (_func_int **)0x0)) {
    piVar3 = __errno_location();
    PosixError((anon_unknown_1 *)&local_28,(string *)(in_RSI + 0x10018),*piVar3);
    pp_Var1 = (this->super_WritableFile)._vptr_WritableFile;
    (this->super_WritableFile)._vptr_WritableFile = local_28._vptr_WritableFile;
    local_28._vptr_WritableFile = pp_Var1;
    Status::~Status((Status *)&local_28);
  }
  *(undefined4 *)(in_RSI + 0x10010) = 0xffffffff;
  return (Status)(char *)this;
}

Assistant:

Status Close() override {
    Status status = FlushBuffer();
    const int close_result = ::close(fd_);
    if (close_result < 0 && status.ok()) {
      status = PosixError(filename_, errno);
    }
    fd_ = -1;
    return status;
  }